

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_level_formatter<spdlog::details::null_scoped_padder>::format
          (short_level_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3
          ,memory_buf_t *dest)

{
  string_view_t view;
  char *pcVar1;
  size_t sVar2;
  memory_buf_t *in_RCX;
  long in_RSI;
  long in_RDI;
  null_scoped_padder p;
  string_view_t level_name;
  char *in_stack_ffffffffffffffb8;
  memory_buf_t *local_38;
  
  pcVar1 = level::to_short_c_str(*(level_enum *)(in_RSI + 0x10));
  std::char_traits<char>::length((char_type *)0x174d39);
  sVar2 = ::fmt::v8::basic_string_view<char>::size
                    ((basic_string_view<char> *)&stack0xffffffffffffffc0);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffbf,sVar2,(padding_info *)(in_RDI + 8),
             in_RCX);
  view.size_ = (size_t)pcVar1;
  view.data_ = in_stack_ffffffffffffffb8;
  fmt_helper::append_string_view(view,local_38);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }